

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
               (CodedInputStream *input,int *value)

{
  bool bVar1;
  uint32 temp;
  uint32 local_c;
  
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_c);
  if (bVar1) {
    *value = local_c;
  }
  return bVar1;
}

Assistant:

inline bool WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
    io::CodedInputStream* input,
    int* value) {
  uint32 temp;
  if (!input->ReadVarint32(&temp)) return false;
  *value = static_cast<int>(temp);
  return true;
}